

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Finalize<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::BitAndOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  data_ptr_t pdVar1;
  char *pcVar2;
  undefined8 uVar3;
  data_ptr_t pdVar4;
  idx_t iVar5;
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar1 = result->data;
    local_48.result_idx = 0;
    pcVar2 = *(char **)states->data;
    if (*pcVar2 == '\0') {
      AggregateFinalizeData::ReturnNull(&local_48);
    }
    else {
      uVar3 = *(undefined8 *)(pcVar2 + 0x10);
      *(undefined8 *)pdVar1 = *(undefined8 *)(pcVar2 + 8);
      *(undefined8 *)(pdVar1 + 8) = uVar3;
    }
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = states->data;
    if (count != 0) {
      pdVar4 = result->data + offset * 0x10;
      iVar5 = 0;
      do {
        local_48.result_idx = offset + iVar5;
        pcVar2 = *(char **)(pdVar1 + iVar5 * 8);
        if (*pcVar2 == '\0') {
          AggregateFinalizeData::ReturnNull(&local_48);
        }
        else {
          uVar3 = *(undefined8 *)(pcVar2 + 0x10);
          *(undefined8 *)pdVar4 = *(undefined8 *)(pcVar2 + 8);
          *(undefined8 *)(pdVar4 + 8) = uVar3;
        }
        iVar5 = iVar5 + 1;
        pdVar4 = pdVar4 + 0x10;
      } while (count != iVar5);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}